

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)

{
  jx9_vm *pjVar1;
  jx9_value *pjVar2;
  sxu32 nIdx;
  sxu32 local_1c;
  
  local_1c = 0;
  pjVar2 = jx9VmReserveConstObj(pGen->pVm,&local_1c);
  if (pjVar2 == (jx9_value *)0x0) {
    jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
  }
  else {
    *pCount = *pCount + 1;
    pjVar1 = pGen->pVm;
    pjVar2->pVm = (jx9_vm *)0x0;
    (pjVar2->sBlob).pAllocator = (SyMemBackend *)0x0;
    (pjVar2->x).rVal = 0.0;
    *(undefined8 *)&pjVar2->iFlags = 0;
    *(undefined8 *)&(pjVar2->sBlob).nFlags = 0;
    *(undefined8 *)&pjVar2->nIdx = 0;
    (pjVar2->sBlob).pBlob = (void *)0x0;
    (pjVar2->sBlob).nByte = 0;
    (pjVar2->sBlob).mByte = 0;
    pjVar2->pVm = pjVar1;
    (pjVar2->sBlob).pAllocator = &pjVar1->sAllocator;
    pjVar2->iFlags = 1;
    jx9VmEmitInstr(pGen->pVm,4,0,local_1c,(void *)0x0,(sxu32 *)0x0);
  }
  return pjVar2;
}

Assistant:

static jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)
{
	jx9_value *pConstObj;
	sxu32 nIdx = 0;
	/* Reserve a new constant */
	pConstObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pConstObj == 0 ){
		GenStateOutOfMem(&(*pGen));
		return 0;
	}
	(*pCount)++;
	jx9MemObjInitFromString(pGen->pVm, pConstObj, 0);
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	return pConstObj;
}